

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDFace::VertexIndex(ON_SubDFace *this,ON_SubDVertex *vertex)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ON_SubDEdgePtr *pOVar6;
  
  if ((vertex != (ON_SubDVertex *)0x0) && (uVar1 = this->m_edge_count, uVar1 != 0)) {
    pOVar6 = this->m_edge4;
    uVar4 = 0;
    do {
      if (uVar4 == 4) {
        pOVar6 = this->m_edgex + -4;
      }
      if (uVar4 == 4 && this->m_edgex == (ON_SubDEdgePtr *)0x0) {
        return 0xffffffff;
      }
      uVar2 = pOVar6[uVar4].m_ptr;
      uVar5 = uVar2 & 0xfffffffffffffff8;
      if (uVar5 != 0) {
        uVar3 = (uint)uVar4;
        if (*(ON_SubDVertex **)(uVar5 + 0x80) == vertex) {
          if ((uVar2 & 1) == 0) {
            return uVar3;
          }
LAB_005cbe0d:
          return (uVar3 | 1) % (uint)uVar1;
        }
        if (*(ON_SubDVertex **)(uVar5 + 0x88) == vertex) {
          if ((uVar2 & 1) != 0) {
            return uVar3;
          }
          goto LAB_005cbe0d;
        }
      }
      uVar4 = uVar4 + 2;
    } while (uVar4 < (uint)uVar1);
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDFace::VertexIndex(
  const ON_SubDVertex* vertex
  ) const
{
  if (nullptr == vertex)
    return ON_UNSET_UINT_INDEX;

  const ON_SubDEdgePtr* face_edges = m_edge4;
  const unsigned int edge_count = m_edge_count;

  for (unsigned int i = 0; i < edge_count; i += 2)
  {
    if (4 == i)
    {
      face_edges = m_edgex;
      if (nullptr == face_edges)
        break;
      face_edges -= 4;
    }
    ON__UINT_PTR e_ptr = face_edges[i].m_ptr;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(e_ptr);
    if (nullptr != edge)
    {
      if (vertex == edge->m_vertex[0])
        return (0 == ON_SUBD_EDGE_DIRECTION(e_ptr)) ? i : ((i + 1) % edge_count);
      if (vertex == edge->m_vertex[1])
        return (0 == ON_SUBD_EDGE_DIRECTION(e_ptr)) ? ((i + 1) % edge_count) : i;
    }
  }

  return ON_UNSET_UINT_INDEX;
}